

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::ktx_texture::get_key_value_as_string(ktx_texture *this,char *pKey,dynamic_string *str)

{
  uint uVar1;
  uint uVar2;
  uint8_vec *this_00;
  size_t sVar3;
  uchar *puVar4;
  uint local_48;
  uint i;
  uint n;
  uint8 *pValue;
  uint ofs;
  uint8_vec *p;
  dynamic_string *str_local;
  char *pKey_local;
  ktx_texture *this_local;
  
  this_00 = find_key(this,pKey);
  if (this_00 == (uint8_vec *)0x0) {
    dynamic_string::clear(str);
    this_local._7_1_ = false;
  }
  else {
    sVar3 = strlen(pKey);
    uVar1 = (int)sVar3 + 1;
    puVar4 = vector<unsigned_char>::get_ptr(this_00);
    uVar2 = vector<unsigned_char>::size(this_00);
    for (local_48 = 0; (local_48 < uVar2 - uVar1 && ((puVar4 + uVar1)[local_48] != '\0'));
        local_48 = local_48 + 1) {
    }
    dynamic_string::set_from_buf(str,puVar4 + uVar1,local_48);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ktx_texture::get_key_value_as_string(const char* pKey, dynamic_string& str) const
    {
        const uint8_vec* p = find_key(pKey);
        if (!p)
        {
            str.clear();
            return false;
        }

        const uint ofs = (static_cast<uint>(strlen(pKey)) + 1);
        const uint8* pValue = p->get_ptr() + ofs;
        const uint n = p->size() - ofs;

        uint i;
        for (i = 0; i < n; i++)
        {
            if (!pValue[i])
            {
                break;
            }
        }

        str.set_from_buf(pValue, i);
        return true;
    }